

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O0

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addVariadicArgumentOperands
          (LLVMPointerGraphBuilder *this,Function *F,PSNode *arg)

{
  bool bVar1;
  const_use_iterator this_00;
  const_use_iterator F_00;
  Use *this_01;
  User *CI_00;
  PSNode *arg_00;
  Function *pFVar2;
  Function *in_RSI;
  Value *in_RDI;
  CallInst *CI;
  Value *use;
  const_use_iterator E;
  const_use_iterator I;
  Value *in_stack_ffffffffffffffb8;
  
  this_00 = llvm::Value::use_begin(in_stack_ffffffffffffffb8);
  F_00 = llvm::Value::use_end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = llvm::Value::use_iterator_impl<const_llvm::Use>::operator!=
                      ((use_iterator_impl<const_llvm::Use> *)in_RDI,
                       (use_iterator_impl<const_llvm::Use> *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    this_01 = llvm::Value::use_iterator_impl<const_llvm::Use>::operator->
                        ((use_iterator_impl<const_llvm::Use> *)0x1b1eca);
    CI_00 = llvm::Use::getUser(this_01);
    arg_00 = (PSNode *)llvm::dyn_cast<llvm::CallInst,llvm::Value_const>(in_RDI);
    if (arg_00 != (PSNode *)0x0) {
      pFVar2 = llvm::CallBase::getCalledFunction((CallBase *)arg_00);
      if (pFVar2 == in_RSI) {
        addVariadicArgumentOperands
                  ((LLVMPointerGraphBuilder *)this_00.U,(Function *)F_00.U,(CallInst *)CI_00,arg_00)
        ;
      }
    }
    llvm::Value::use_iterator_impl<const_llvm::Use>::operator++
              ((use_iterator_impl<const_llvm::Use> *)in_RDI);
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addVariadicArgumentOperands(
        const llvm::Function *F, PSNode *arg) {
    using namespace llvm;

    for (auto I = F->use_begin(), E = F->use_end(); I != E; ++I) {
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 5))
        const Value *use = *I;
#else
        const Value *use = I->getUser();
#endif
        const CallInst *CI = dyn_cast<CallInst>(use);
        if (CI && CI->getCalledFunction() == F)
            addVariadicArgumentOperands(F, CI, arg);
        // if this is funcptr, we handle it in the other
        // version of addVariadicArgumentOperands
    }
}